

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  TonkResult TVar1;
  long lVar2;
  fp_tonk_file_free_t p_Var3;
  long lVar4;
  
  if (fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0) {
    std::mutex::lock(&FunctionPointerLock);
    lVar4 = 0;
    do {
      lVar2 = 0;
      if (lVar4 == 0x80) break;
      lVar2 = dlopen(*(undefined8 *)((long)kLibrarySearchPaths_64 + lVar4),2);
      lVar4 = lVar4 + 8;
    } while (lVar2 == 0);
    fp_tonk_result_to_string = (fp_tonk_result_to_string_t)dlsym(lVar2,"tonk_result_to_string");
    if ((((((fp_tonk_result_to_string == (fp_tonk_result_to_string_t)0x0) ||
           (fp_tonk_socket_create = (fp_tonk_socket_create_t)dlsym(lVar2,"tonk_socket_create"),
           fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0)) ||
          (fp_tonk_advertise = (fp_tonk_advertise_t)dlsym(lVar2,"tonk_advertise"),
          fp_tonk_advertise == (fp_tonk_advertise_t)0x0)) ||
         (((fp_tonk_inject = (fp_tonk_inject_t)dlsym(lVar2,"tonk_inject"),
           fp_tonk_inject == (fp_tonk_inject_t)0x0 ||
           (fp_tonk_socket_destroy = (fp_tonk_socket_destroy_t)dlsym(lVar2,"tonk_socket_destroy"),
           fp_tonk_socket_destroy == (fp_tonk_socket_destroy_t)0x0)) ||
          ((fp_tonk_connect = (fp_tonk_connect_t)dlsym(lVar2,"tonk_connect"),
           fp_tonk_connect == (fp_tonk_connect_t)0x0 ||
           ((fp_tonk_status = (fp_tonk_status_t)dlsym(lVar2,"tonk_status"),
            fp_tonk_status == (fp_tonk_status_t)0x0 ||
            (fp_tonk_status_ex = (fp_tonk_status_ex_t)dlsym(lVar2,"tonk_status_ex"),
            fp_tonk_status_ex == (fp_tonk_status_ex_t)0x0)))))))) ||
        ((fp_tonk_send = (fp_tonk_send_t)dlsym(lVar2,"tonk_send"),
         fp_tonk_send == (fp_tonk_send_t)0x0 ||
         ((((((fp_tonk_flush = (fp_tonk_flush_t)dlsym(lVar2,"tonk_flush"),
              fp_tonk_flush == (fp_tonk_flush_t)0x0 ||
              (fp_tonk_close = (fp_tonk_close_t)dlsym(lVar2,"tonk_close"),
              fp_tonk_close == (fp_tonk_close_t)0x0)) ||
             (fp_tonk_free = (fp_tonk_free_t)dlsym(lVar2,"tonk_free"),
             fp_tonk_free == (fp_tonk_free_t)0x0)) ||
            ((fp_tonk_time = (fp_tonk_time_t)dlsym(lVar2,"tonk_time"),
             fp_tonk_time == (fp_tonk_time_t)0x0 ||
             (fp_tonk_to_remote_time_16 =
                   (fp_tonk_to_remote_time_16_t)dlsym(lVar2,"tonk_to_remote_time_16"),
             fp_tonk_to_remote_time_16 == (fp_tonk_to_remote_time_16_t)0x0)))) ||
           ((fp_tonk_from_local_time_16 =
                  (fp_tonk_from_local_time_16_t)dlsym(lVar2,"tonk_from_local_time_16"),
            fp_tonk_from_local_time_16 == (fp_tonk_from_local_time_16_t)0x0 ||
            ((fp_tonk_to_remote_time_23 =
                   (fp_tonk_to_remote_time_23_t)dlsym(lVar2,"tonk_to_remote_time_23"),
             fp_tonk_to_remote_time_23 == (fp_tonk_to_remote_time_23_t)0x0 ||
             (fp_tonk_from_local_time_23 =
                   (fp_tonk_from_local_time_23_t)dlsym(lVar2,"tonk_from_local_time_23"),
             fp_tonk_from_local_time_23 == (fp_tonk_from_local_time_23_t)0x0)))))) ||
          (fp_tonk_p2p_connect = (fp_tonk_p2p_connect_t)dlsym(lVar2,"tonk_p2p_connect"),
          fp_tonk_p2p_connect == (fp_tonk_p2p_connect_t)0x0)))))) ||
       ((((fp_tonk_set_default_socket_config =
                (fp_tonk_set_default_socket_config_t)dlsym(lVar2,"tonk_set_default_socket_config"),
          fp_tonk_set_default_socket_config == (fp_tonk_set_default_socket_config_t)0x0 ||
          (fp_tonk_file_from_disk = (fp_tonk_file_from_disk_t)dlsym(lVar2,"tonk_file_from_disk"),
          fp_tonk_file_from_disk == (fp_tonk_file_from_disk_t)0x0)) ||
         (fp_tonk_file_from_buffer =
               (fp_tonk_file_from_buffer_t)dlsym(lVar2,"tonk_file_from_buffer"),
         fp_tonk_file_from_buffer == (fp_tonk_file_from_buffer_t)0x0)) ||
        ((fp_tonk_file_send = (fp_tonk_file_send_t)dlsym(lVar2,"tonk_file_send"),
         fp_tonk_file_send == (fp_tonk_file_send_t)0x0 ||
         (fp_tonk_file_receive = (fp_tonk_file_receive_t)dlsym(lVar2,"tonk_file_receive"),
         fp_tonk_file_receive == (fp_tonk_file_receive_t)0x0)))))) {
      pthread_mutex_unlock((pthread_mutex_t *)&FunctionPointerLock);
    }
    else {
      p_Var3 = (fp_tonk_file_free_t)dlsym(lVar2,"tonk_file_free");
      fp_tonk_file_free = p_Var3;
      pthread_mutex_unlock((pthread_mutex_t *)&FunctionPointerLock);
      if (p_Var3 != (fp_tonk_file_free_t)0x0) goto LAB_001059e3;
    }
    if (socketOut != (TonkSocket *)0x0) {
      *socketOut = (TonkSocket)0x0;
    }
    if (errorJsonOut != (TonkJson *)0x0) {
      strncpy(errorJsonOut->JsonString,"{ \"description\": \"Tonk DLL Not Found\" }",0x400);
      errorJsonOut->JsonString[0x3ff] = '\0';
    }
    return Tonk_DLL_Not_Found;
  }
LAB_001059e3:
  TVar1 = (*fp_tonk_socket_create)(config,socketOut,errorJsonOut);
  return TVar1;
}

Assistant:

TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    if (!fp_tonk_socket_create &&
        !LoadTonkLibrary())
    {
        if (socketOut) {
            *socketOut = nullptr;
        }
        if (errorJsonOut) {
            SafeCopyCStr(
                &errorJsonOut->JsonString[0],
                sizeof(TonkJson::JsonString),
                "{ \"description\": \"Tonk DLL Not Found\" }");
        }
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_socket_create(
        config,
        socketOut,
        errorJsonOut);
}